

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O2

void do_oracles(char *infile,char *outfile)

{
  bool bVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  long __off;
  uint local_244;
  char tempfile [256];
  long offset;
  
  sprintf(tempfile,"%s.%s",outfile,"tmp");
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
    perror(infile);
  }
  else {
    ofp = (FILE *)fopen(outfile,"w+");
    if ((FILE *)ofp == (FILE *)0x0) {
      perror(outfile);
      fclose((FILE *)ifp);
    }
    else {
      tfp = (FILE *)fopen(tempfile,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar6 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
        for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 4) {
          xcrypt((char *)((long)&special_oracle_rel +
                         (long)*(int *)((long)&special_oracle_rel + lVar6)));
          fputs(xcrypt::buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
        }
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar6 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
        local_244 = 1;
LAB_0010acb2:
        bVar2 = true;
LAB_0010acb4:
        while (pcVar7 = fgets(in_line,0x100,(FILE *)ifp), pcVar7 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",&offset);
            iVar4 = bcmp(in_line,"-----",5);
            if (iVar4 == 0) goto code_r0x0010ad00;
            xcrypt(in_line);
            fputs(xcrypt::buf,(FILE *)tfp);
            bVar2 = false;
          }
        }
        if (!bVar2) {
          local_244 = local_244 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar3 = ofp;
          lVar6 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
        }
        lVar6 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",tempfile);
        iVar4 = fseek((FILE *)tfp,0,0);
        if (iVar4 == 0) {
          while (pcVar7 = fgets(in_line,0x100,(FILE *)tfp), pcVar7 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
          }
          fclose((FILE *)tfp);
          unlink(tempfile);
          sprintf(in_line,"rewind of \"%s\"",outfile);
          iVar4 = fseek((FILE *)ofp,0,0);
          if (iVar4 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",outfile);
            iVar4 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)local_244);
            if (-1 < iVar4) {
              sprintf(in_line,"data rewrite of \"%s\"",outfile);
              iVar4 = -1;
              do {
                iVar4 = iVar4 + 1;
                if ((int)local_244 < iVar4) {
                  fclose((FILE *)ofp);
                  return;
                }
                __off = ftell((FILE *)ofp);
              } while ((((-1 < __off) && (iVar5 = fseek((FILE *)ofp,__off,0), -1 < iVar5)) &&
                       (iVar5 = __isoc99_fscanf(ofp,"%5lx",&offset), iVar5 == 1)) &&
                      ((iVar5 = fseek((FILE *)ofp,__off,0), -1 < iVar5 &&
                       (iVar5 = fprintf((FILE *)ofp,"%05lx\n",offset + lVar6), -1 < iVar5))));
            }
          }
        }
        perror(in_line);
        fclose((FILE *)ofp);
        goto LAB_0010af8c;
      }
      perror(tempfile);
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
LAB_0010af8c:
      unlink(outfile);
    }
  }
  exit(1);
code_r0x0010ad00:
  bVar1 = !bVar2;
  bVar2 = true;
  if (bVar1) goto LAB_0010ad28;
  goto LAB_0010acb4;
LAB_0010ad28:
  local_244 = local_244 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar3 = ofp;
  lVar6 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar3,"%05lx\n",lVar6);
  goto LAB_0010acb2;
}

Assistant:

void do_oracles(const char *infile, const char *outfile)
{
	char	tempfile[256];
	boolean in_oracle, ok;
	long	txt_offset, offset, fpos;
	int	oracle_cnt;
	int i;

	sprintf(tempfile, "%s.%s", outfile, "tmp");

	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}
	if (!(tfp = fopen(tempfile, WRTMODE))) {	/* oracles.tmp */
		perror(tempfile);
		fclose(ifp);
		fclose(ofp);
		unlink(outfile);
		exit(EXIT_FAILURE);
	}

	/* output a dummy header record; we'll rewind and overwrite it later */
	fprintf(ofp, "%s%5d\n", Dont_Edit_Data, 0);

	/* handle special oracle; it must come first */
	fputs("---\n", tfp);
	fprintf(ofp, "%05lx\n", ftell(tfp));  /* start pos of special oracle */
	for (i = 0; i < SIZE(special_oracle); i++) {
	    fputs(xcrypt(special_oracle[i]), tfp);
	    fputc('\n', tfp);
	}

	oracle_cnt = 1;
	fputs("---\n", tfp);
	fprintf(ofp, "%05lx\n", ftell(tfp));	/* start pos of first oracle */
	in_oracle = FALSE;

	while (fgets(in_line, sizeof in_line, ifp)) {

	    if (h_filter(in_line)) continue;
	    if (!strncmp(in_line, "-----", 5)) {
		if (!in_oracle) continue;
		in_oracle = FALSE;
		oracle_cnt++;
		fputs("---\n", tfp);
		fprintf(ofp, "%05lx\n", ftell(tfp));
		/* start pos of this oracle */
	    } else {
		in_oracle = TRUE;
		fputs(xcrypt(in_line), tfp);
	    }
	}

	if (in_oracle) {	/* need to terminate last oracle */
	    oracle_cnt++;
	    fputs("---\n", tfp);
	    fprintf(ofp, "%05lx\n", ftell(tfp));	/* eof position */
	}

	/* record the current position */
	txt_offset = ftell(ofp);
	fclose(ifp);		/* all done with original input file */

	/* reprocess the scratch file; 1st format an error msg, just in case */
	sprintf(in_line, "rewind of \"%s\"", tempfile);
	if (rewind(tfp) != 0)  goto dead_data;
	/* copy all lines of text from the scratch file into the output file */
	while (fgets(in_line, sizeof in_line, tfp))
	    fputs(in_line, ofp);

	/* finished with scratch file */
	fclose(tfp);
	unlink(tempfile);	/* remove it */

	/* update the first record of the output file; prepare error msg 1st */
	sprintf(in_line, "rewind of \"%s\"", outfile);
	ok = (rewind(ofp) == 0);
	if (ok) {
	    sprintf(in_line, "header rewrite of \"%s\"", outfile);
	    ok = (fprintf(ofp, "%s%5d\n", Dont_Edit_Data, oracle_cnt) >=0);
	}
	if (ok) {
	    sprintf(in_line, "data rewrite of \"%s\"", outfile);
	    for (i = 0; i <= oracle_cnt; i++) {
		if (!(ok = (fpos = ftell(ofp)) >= 0)) break;
		if (!(ok = (fseek(ofp, fpos, SEEK_SET) >= 0))) break;
		if (!(ok = (fscanf(ofp, "%5lx", &offset) == 1))) break;
		if (!(ok = (fseek(ofp, fpos, SEEK_SET) >= 0))) break;
		if (!(ok = (fprintf(ofp, "%05lx\n", offset + txt_offset) >= 0)))
		    break;
	    }
	}
	if (!ok) {
dead_data:  perror(in_line);	/* report the problem */
	    /* close and kill the aborted output file, then give up */
	    fclose(ofp);
	    unlink(outfile);
	    exit(EXIT_FAILURE);
	}

	/* all done */
	fclose(ofp);

	return;
}